

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteSiCurrentLoopParams(AmpIO *this,uint index,SiCurrentLoopParams *params)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *this_00;
  void *this_01;
  bool success;
  SiCurrentLoopParams *params_local;
  uint index_local;
  AmpIO *this_local;
  
  if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar2 < 7) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
      if (uVar2 == 0x64524131) {
        if (index < this->NumMotors) {
          if (params->kp < 0x40000) {
            if (params->ki < 0x40000) {
              if (params->kd < 0x40000) {
                if (params->iTermLimit < 0x400) {
                  if (params->dutyCycleLimit < 0x400) {
                    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
                    uVar3 = (*pBVar1->_vptr_BasePort[0x24])
                                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                                       (ulong)((index + 1) * 0x10 | 0x9001),(ulong)params->kp);
                    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
                    iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                                       (ulong)((index + 1) * 0x10 | 0x9002),(ulong)params->ki);
                    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
                    iVar5 = (*pBVar1->_vptr_BasePort[0x24])
                                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                                       (ulong)((index + 1) * 0x10 | 0x9005),(ulong)params->kd);
                    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
                    iVar6 = (*pBVar1->_vptr_BasePort[0x24])
                                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                                       (ulong)((index + 1) * 0x10 | 0x9006),
                                       (ulong)params->ff_resistive);
                    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
                    iVar7 = (*pBVar1->_vptr_BasePort[0x24])
                                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                                       (ulong)((index + 1) * 0x10 | 0x9003),
                                       (ulong)params->iTermLimit);
                    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
                    iVar8 = (*pBVar1->_vptr_BasePort[0x24])
                                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                                       (ulong)((index + 1) * 0x10 | 0x9004),
                                       (ulong)params->dutyCycleLimit);
                    this_local._7_1_ =
                         ((((((uVar3 & 1) != 0 & (byte)iVar4 & 1) != 0 & (byte)iVar5 & 1) != 0 &
                           (byte)iVar6 & 1) != 0 & (byte)iVar7 & 1) != 0 & (byte)iVar8 & 1) != 0;
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_00 = std::operator<<((ostream *)&std::cerr,
                                  "AmpIO::WriteSiCurrentLoopParams not implemented for ");
        uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
        this_01 = (void *)std::ostream::operator<<(this_00,uVar2);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteSiCurrentLoopParams(unsigned int index, const SiCurrentLoopParams& params) const
{
    if (!port) return false;
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() != dRA1_String) {
        std::cerr << "AmpIO::WriteSiCurrentLoopParams not implemented for " << GetHardwareVersion() << std::endl;
        return false;
    }
    if (index >= NumMotors) return false;
    if (params.kp >= 1 << 18) return false;
    if (params.ki >= 1 << 18) return false;
    if (params.kd >= 1 << 18) return false;
    if (params.iTermLimit > 1023) return false;
    if (params.dutyCycleLimit > 1023) return false;

    bool success = true;
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_KP, params.kp);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_KI, params.ki);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_KD, params.kd);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_FF_RESISTIVE, params.ff_resistive);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_I_TERM_LIMIT, params.iTermLimit);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_DUTY_CYCLE_LIMIT, params.dutyCycleLimit);
    return success;
}